

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall ui::anon_unknown_1::PanelAdapter::~PanelAdapter(PanelAdapter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__PanelAdapter_00173d30;
  p_Var1 = (this->panel_).super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->title_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  ftxui::ComponentBase::~ComponentBase(&this->super_ComponentBase);
  operator_delete(this,0x48);
  return;
}

Assistant:

PanelAdapter(Panel panel) : panel_(panel) {
    title_ = Renderer([&](bool focused) {
      auto style = focused ? inverted : nothing;
      return text(panel_->Title()) | style;
    });

    Add(Container::Vertical({
        title_,
        panel_,
    }));
  }